

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string *message)

{
  string *psVar1;
  char *pcVar2;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lock;
  undefined1 local_40 [8];
  string msg;
  string *message_local;
  GenT genType_local;
  Logger *this_local;
  
  msg.field_2._8_8_ = message;
  psVar1 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::__cxx11::string::string((string *)local_40,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)local_40,": ");
  std::__cxx11::string::operator+=((string *)local_40,(string *)msg.field_2._8_8_);
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 != '\n') {
    std::__cxx11::string::push_back((char)local_40);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_58,&this->Mutex_);
  cmSystemTools::Stdout((string *)local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_58);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     std::string const& message) const
{
  std::string msg = GeneratorName(genType);
  msg += ": ";
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}